

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
                  *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->b).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->a).a.b.d);
  return;
}

Assistant:

~QStringBuilder() = default;